

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void la_miam_errors_format_text(la_vstring *vstr,uint32_t err,int indent)

{
  void *pvVar1;
  uint in_EDX;
  uint in_ESI;
  la_vstring *in_RDI;
  char *errmsg;
  uint32_t i;
  uint local_14;
  
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    if ((in_ESI & 1 << ((byte)local_14 & 0x1f)) != 0) {
      pvVar1 = la_dict_search(la_miam_errors_format_text::la_miam_error_messages,
                              in_ESI & 1 << ((byte)local_14 & 0x1f));
      if (pvVar1 == (void *)0x0) {
        la_vstring_append_sprintf
                  (in_RDI,"%*s-- Unknown error (%u)\n",(ulong)in_EDX,"",(ulong)in_ESI);
      }
      else {
        la_vstring_append_sprintf(in_RDI,"%*s-- %s\n",(ulong)in_EDX,"",pvVar1);
      }
    }
  }
  return;
}

Assistant:

static void la_miam_errors_format_text(la_vstring *vstr, uint32_t err, int indent) {
	static la_dict const la_miam_error_messages[] = {
		{ .id = LA_MIAM_ERR_SUCCESS,                    .val = "No error" },
		{ .id = LA_MIAM_ERR_HDR_PDU_TYPE_UNKNOWN,       .val = "Unknown PDU type" },
		{ .id = LA_MIAM_ERR_HDR_PDU_VERSION_UNKNOWN,    .val = "Unsupported MIAM version" },
		{ .id = LA_MIAM_ERR_HDR_TRUNCATED,              .val = "Header truncated" },
		{ .id = LA_MIAM_ERR_HDR_APP_TYPE_UNKNOWN,       .val = "Unknown application type" },
		{ .id = LA_MIAM_ERR_BODY_TRUNCATED,             .val = "Message truncated" },
		{ .id = LA_MIAM_ERR_BODY_INFLATE_FAILED,        .val = "Decompression failed" },
		{ .id = LA_MIAM_ERR_BODY_COMPR_UNSUPPORTED,     .val = "Unsupported compression algorithm" },
		{ .id = LA_MIAM_ERR_BODY_CRC_FAILED,            .val = "CRC check failed" },
		{ .id = 0,                                      .val = NULL }
	};
	la_assert(vstr != NULL);
	la_assert(indent >= 0);
	for(uint32_t i = 0; i < 32; i++) {
		if((err & (1 << i)) != 0) {
			char *errmsg = la_dict_search(la_miam_error_messages, (int)(err & (1 << i)));
			if(errmsg != NULL) {
				LA_ISPRINTF(vstr, indent, "-- %s\n", errmsg);
			} else {
				LA_ISPRINTF(vstr, indent, "-- Unknown error (%u)\n", err);
			}
		}
	}
}